

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequence.h
# Opt level: O0

Sequence<Protein> * __thiscall
Sequence<Protein>::Subsequence
          (Sequence<Protein> *__return_storage_ptr__,Sequence<Protein> *this,size_t pos,size_t len_)

{
  size_t sVar1;
  ulong uVar2;
  allocator local_89;
  string local_88;
  byte local_52;
  allocator local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  size_t local_30;
  size_t len;
  size_t len__local;
  size_t pos_local;
  Sequence<Protein> *this_local;
  
  local_30 = len_;
  len = len_;
  len__local = pos;
  pos_local = (size_t)this;
  this_local = __return_storage_ptr__;
  if (len_ == 0xffffffffffffffff) {
    local_30 = Length(this);
    local_30 = local_30 - len__local;
  }
  sVar1 = len__local;
  uVar2 = std::__cxx11::string::length();
  local_52 = 0;
  if (sVar1 < uVar2) {
    std::__cxx11::string::substr((ulong)&local_50,(ulong)&this->sequence);
  }
  else {
    std::allocator<char>::allocator();
    local_52 = 1;
    std::__cxx11::string::string((string *)&local_50,"",&local_51);
  }
  sVar1 = len__local;
  uVar2 = std::__cxx11::string::length();
  if (uVar2 <= sVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_88,"",&local_89);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_88,(ulong)&this->quality);
  }
  Sequence(__return_storage_ptr__,&this->identifier,&local_50,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  if (uVar2 <= sVar1) {
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
  }
  std::__cxx11::string::~string((string *)&local_50);
  if ((local_52 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
  }
  return __return_storage_ptr__;
}

Assistant:

Sequence< A > Sequence< A >::Subsequence( const size_t pos,
                                          const size_t len_ ) const {
  size_t len = len_;
  if( len == std::string::npos ) {
    len = Length() - pos;
  }

  return Sequence( identifier,
                   pos < sequence.length() ? sequence.substr( pos, len ) : "",
                   pos < quality.length() ? quality.substr( pos, len ) : "" );
}